

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O3

void __thiscall nv::DDSHeader::setMipmapCount(DDSHeader *this,uint count)

{
  uint uVar1;
  
  if (count < 2) {
    this->flags = this->flags & 0xfffdffff;
    this->mipmapcount = 0;
    uVar1 = (uint)((this->caps).caps2 != 0) * 8 + 0x1000;
  }
  else {
    this->flags = this->flags | 0x20000;
    this->mipmapcount = count;
    uVar1 = (this->caps).caps1 | 0x400008;
  }
  (this->caps).caps1 = uVar1;
  return;
}

Assistant:

void DDSHeader::setMipmapCount(uint count)
{
	if (count == 0 || count == 1)
	{
		this->flags &= ~DDSD_MIPMAPCOUNT;
		this->mipmapcount = 0;
		
		if (this->caps.caps2 == 0) {
			this->caps.caps1 = DDSCAPS_TEXTURE;
		}
		else {
			this->caps.caps1 = DDSCAPS_TEXTURE | DDSCAPS_COMPLEX;
		}
	}
	else
	{
		this->flags |= DDSD_MIPMAPCOUNT;
		this->mipmapcount = count;

		this->caps.caps1 |= DDSCAPS_COMPLEX | DDSCAPS_MIPMAP;
	}
}